

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

CVmObjList * CVmPack::create_group_sublist(CVmObjList *parent_list,int *parent_cnt)

{
  vm_obj_id_t obj;
  CVmObject *idx;
  int *in_RSI;
  size_t in_RDI;
  CVmObjList *sublst;
  vm_val_t ele;
  size_t in_stack_ffffffffffffffd8;
  vm_datatype_t in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  obj = CVmObjList::create(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffe0,obj);
  idx = vm_objp(0);
  CVmObjList::cons_clear
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  CVmObjList::cons_ensure_space(sublst,in_RDI,(size_t)in_RSI);
  *in_RSI = *in_RSI + 1;
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(size_t)idx
             ,(vm_val_t *)0x328403);
  return (CVmObjList *)idx;
}

Assistant:

CVmObjList *CVmPack::create_group_sublist(
    VMG_ CVmObjList *parent_list, int *parent_cnt)
{
    /* create the new sublist */
    vm_val_t ele;
    ele.set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *sublst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);

    /* clear it, since we'll be filling it in iteratively */
    sublst->cons_clear();

    /* 
     *   Add it to the parent list.  The parent list is on the stack (or in a
     *   list that's on the stack, or in a list that's in a list on the
     *   stack, etc) - that will protect the new list from premature garbage
     *   collection.
     */
    parent_list->cons_ensure_space(vmg_ *parent_cnt, 10);
    parent_list->cons_set_element((*parent_cnt)++, &ele);

    /* return the sublist */
    return sublst;
}